

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.cpp
# Opt level: O1

void __thiscall foxxll::mmap_file::serve(mmap_file *this)

{
  size_type in_RCX;
  offset_type in_RDX;
  void *in_RSI;
  read_or_write in_R8D;
  
  serve((mmap_file *)
        ((long)&(this->super_ufs_file_base)._vptr_ufs_file_base +
        (long)(this->super_ufs_file_base)._vptr_ufs_file_base[-5]),in_RSI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

void mmap_file::serve(void* buffer, offset_type offset, size_type bytes,
                      request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    //assert(offset + bytes <= _size());

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    int prot = (op == request::READ) ? PROT_READ : PROT_WRITE;
    void* mem = mmap(nullptr, bytes, prot, MAP_SHARED, file_des_, offset);

    if (mem == MAP_FAILED)
    {
        FOXXLL_THROW_ERRNO(
            io_error,
            " mmap() failed." <<
                " path=" << filename_ <<
                " bytes=" << bytes <<
                " Page size: " << sysconf(_SC_PAGESIZE) <<
                " offset modulo page size " << (offset % sysconf(_SC_PAGESIZE))
        );
    }
    else if (mem == 0)
    {
        FOXXLL_THROW_ERRNO(io_error, "mmap() returned nullptr");
    }
    else
    {
        if (op == request::READ)
        {
            memcpy(buffer, mem, bytes);
        }
        else
        {
            memcpy(mem, buffer, bytes);
        }
        FOXXLL_THROW_ERRNO_NE_0(
            munmap(mem, bytes), io_error,
            "munmap() failed"
        );
    }
}